

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::CurrencyPluralInfo::getCurrencyPluralPattern
          (CurrencyPluralInfo *this,UnicodeString *pluralCount,UnicodeString *result)

{
  Hashtable *this_00;
  int8_t iVar1;
  UnicodeString *src;
  ConstChar16Ptr local_90;
  ConstChar16Ptr local_88;
  char16_t *local_80;
  char16_t *local_70;
  UnicodeString local_60;
  
  src = (UnicodeString *)Hashtable::get(this->fPluralCountToCurrencyUnitPattern,pluralCount);
  if (src == (UnicodeString *)0x0) {
    local_88.p_ = (char16_t *)gPluralCountOther;
    iVar1 = UnicodeString::compare(pluralCount,&local_88,5);
    local_70 = local_88.p_;
    if (iVar1 != '\0') {
      this_00 = this->fPluralCountToCurrencyUnitPattern;
      local_90.p_ = (char16_t *)gPluralCountOther;
      UnicodeString::UnicodeString(&local_60,'\x01',&local_90,5);
      src = (UnicodeString *)Hashtable::get(this_00,&local_60);
      UnicodeString::~UnicodeString(&local_60);
      local_80 = local_90.p_;
      if (src != (UnicodeString *)0x0) goto LAB_0027c003;
    }
    UnicodeString::UnicodeString(&local_60,(UChar *)gDefaultCurrencyPluralPattern);
    UnicodeString::moveFrom(result,&local_60);
    UnicodeString::~UnicodeString(&local_60);
  }
  else {
LAB_0027c003:
    UnicodeString::operator=(result,src);
  }
  return result;
}

Assistant:

UnicodeString&
CurrencyPluralInfo::getCurrencyPluralPattern(const UnicodeString&  pluralCount,
                                             UnicodeString& result) const {
    const UnicodeString* currencyPluralPattern = 
        (UnicodeString*)fPluralCountToCurrencyUnitPattern->get(pluralCount);
    if (currencyPluralPattern == nullptr) {
        // fall back to "other"
        if (pluralCount.compare(gPluralCountOther, 5)) {
            currencyPluralPattern = 
                (UnicodeString*)fPluralCountToCurrencyUnitPattern->get(UnicodeString(TRUE, gPluralCountOther, 5));
        }
        if (currencyPluralPattern == nullptr) {
            // no currencyUnitPatterns defined, 
            // fallback to predefined default.
            // This should never happen when ICU resource files are
            // available, since currencyUnitPattern of "other" is always
            // defined in root.
            result = UnicodeString(gDefaultCurrencyPluralPattern);
            return result;
        }
    }
    result = *currencyPluralPattern;
    return result;
}